

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params_dup.c
# Opt level: O0

OSSL_PARAM * OSSL_PARAM_merge(OSSL_PARAM *p1,OSSL_PARAM *p2)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  long *in_RSI;
  long *in_RDI;
  int diff;
  size_t list2_sz;
  size_t list1_sz;
  OSSL_PARAM *dst;
  OSSL_PARAM *params;
  OSSL_PARAM **p2cur;
  OSSL_PARAM **p1cur;
  OSSL_PARAM *p;
  OSSL_PARAM *list2 [129];
  OSSL_PARAM *list1 [129];
  char *func;
  char *file;
  char *in_stack_fffffffffffff7a0;
  OSSL_PARAM *__dest;
  OSSL_PARAM *pOVar3;
  long *local_850;
  long *local_848;
  long *local_840;
  long local_838 [16];
  long local_428 [130];
  long *local_18;
  OSSL_PARAM *local_8;
  
  file = (char *)0x0;
  func = (char *)0x0;
  if ((in_RDI == (long *)0x0) && (in_RSI == (long *)0x0)) {
    local_8 = (OSSL_PARAM *)0x0;
  }
  else {
    local_840 = in_RDI;
    local_18 = in_RSI;
    if (in_RDI != (long *)0x0) {
      for (; *local_840 != 0 && file < (char *)0x80; local_840 = local_840 + 5) {
        local_428[(long)file] = (long)local_840;
        file = file + 1;
      }
    }
    local_428[(long)file] = 0;
    if (local_18 != (long *)0x0) {
      for (local_840 = local_18; *local_840 != 0 && func < (char *)0x80; local_840 = local_840 + 5)
      {
        local_838[(long)func] = (long)local_840;
        func = func + 1;
      }
    }
    local_838[(long)func] = 0;
    if ((file == (char *)0x0) && (func == (char *)0x0)) {
      local_8 = (OSSL_PARAM *)0x0;
    }
    else {
      qsort(local_428,(size_t)file,8,compare_params);
      qsort(local_838,(size_t)func,8,compare_params);
      pOVar2 = (OSSL_PARAM *)
               CRYPTO_zalloc((size_t)in_stack_fffffffffffff7a0,file,(int)((ulong)func >> 0x20));
      iVar1 = (int)((ulong)file >> 0x20);
      if (pOVar2 == (OSSL_PARAM *)0x0) {
        ERR_new();
        ERR_set_debug(in_stack_fffffffffffff7a0,iVar1,func);
        ERR_set_error(0xf,0xc0100,(char *)0x0);
        local_8 = (OSSL_PARAM *)0x0;
      }
      else {
        local_848 = local_428;
        local_850 = local_838;
        __dest = pOVar2;
        while (*local_848 != 0) {
          if (*local_850 == 0) {
            do {
              pOVar3 = __dest + 1;
              memcpy(__dest,(void *)*local_848,0x28);
              local_848 = local_848 + 1;
              __dest = pOVar3;
            } while (*local_848 != 0);
            return pOVar2;
          }
          iVar1 = strcasecmp(*(char **)*local_848,*(char **)*local_850);
          if (iVar1 == 0) {
            pOVar3 = __dest + 1;
            memcpy(__dest,(void *)*local_850,0x28);
            local_850 = local_850 + 1;
            local_848 = local_848 + 1;
            __dest = pOVar3;
          }
          else if (iVar1 < 1) {
            pOVar3 = __dest + 1;
            memcpy(__dest,(void *)*local_848,0x28);
            local_848 = local_848 + 1;
            __dest = pOVar3;
          }
          else {
            pOVar3 = __dest + 1;
            memcpy(__dest,(void *)*local_850,0x28);
            local_850 = local_850 + 1;
            __dest = pOVar3;
          }
        }
        do {
          pOVar3 = __dest + 1;
          memcpy(__dest,(void *)*local_850,0x28);
          local_850 = local_850 + 1;
          __dest = pOVar3;
          local_8 = pOVar2;
        } while (*local_850 != 0);
      }
    }
  }
  return local_8;
}

Assistant:

OSSL_PARAM *OSSL_PARAM_merge(const OSSL_PARAM *p1, const OSSL_PARAM *p2)
{
    const OSSL_PARAM *list1[OSSL_PARAM_MERGE_LIST_MAX + 1];
    const OSSL_PARAM *list2[OSSL_PARAM_MERGE_LIST_MAX + 1];
    const OSSL_PARAM *p = NULL;
    const OSSL_PARAM **p1cur, **p2cur;
    OSSL_PARAM *params, *dst;
    size_t  list1_sz = 0, list2_sz = 0;
    int diff;

    if (p1 == NULL && p2 == NULL)
        return NULL;

    /* Copy p1 to list1 */
    if (p1 != NULL) {
        for (p = p1; p->key != NULL && list1_sz < OSSL_PARAM_MERGE_LIST_MAX; p++)
            list1[list1_sz++] = p;
    }
    list1[list1_sz] = NULL;

    /* copy p2 to a list2 */
    if (p2 != NULL) {
        for (p = p2; p->key != NULL && list2_sz < OSSL_PARAM_MERGE_LIST_MAX; p++)
            list2[list2_sz++] = p;
    }
    list2[list2_sz] = NULL;
    if (list1_sz == 0 && list2_sz == 0)
        return NULL;

    /* Sort the 2 lists */
    qsort(list1, list1_sz, sizeof(OSSL_PARAM *), compare_params);
    qsort(list2, list2_sz, sizeof(OSSL_PARAM *), compare_params);

   /* Allocate enough space to store the merged parameters */
    params = OPENSSL_zalloc((list1_sz + list2_sz + 1) * sizeof(*p1));
    if (params == NULL) {
        ERR_raise(ERR_LIB_CRYPTO, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    dst = params;
    p1cur = list1;
    p2cur = list2;
    while (1) {
        /* If list1 is finished just tack list2 onto the end */
        if (*p1cur == NULL) {
            do {
                *dst++ = **p2cur;
                p2cur++;
            } while (*p2cur != NULL);
            break;
        }
        /* If list2 is finished just tack list1 onto the end */
        if (*p2cur == NULL) {
            do {
                *dst++ = **p1cur;
                p1cur++;
            } while (*p1cur != NULL);
            break;
        }
        /* consume the list element with the smaller key */
        diff = strcasecmp((*p1cur)->key, (*p2cur)->key);
        if (diff == 0) {
            /* If the keys are the same then throw away the list1 element */
            *dst++ = **p2cur;
            p2cur++;
            p1cur++;
        } else if (diff > 0) {
            *dst++ = **p2cur;
            p2cur++;
        } else {
            *dst++ = **p1cur;
            p1cur++;
        }
    }
    return params;
}